

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.c
# Opt level: O0

void event_interrupt(iio_event_data *data)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined4 local_3c;
  undefined4 local_38;
  int different;
  int channel2;
  int channel;
  int direction;
  int type;
  int modifier;
  int chan_type;
  iio_event_data *data_local;
  
  puVar1 = &local_38;
  puVar2 = &local_3c;
  _modifier = data;
  mraa_iio_event_extract_event(data,&type,&direction,&channel,&channel2,&different,puVar1,puVar2);
  fprintf(_stdout,
          "event time %lld id %lld extracted chan_type %d modifier %d type %d direction %d channel %d channel2 %d different %d\n"
          ,_modifier->timestamp,_modifier->id,(ulong)(uint)type,(ulong)(uint)direction,
          CONCAT44((int)((ulong)puVar1 >> 0x20),channel),
          CONCAT44((int)((ulong)puVar2 >> 0x20),channel2),different,local_38,local_3c);
  return;
}

Assistant:

void
event_interrupt(struct iio_event_data* data)
{
    int chan_type;
    int modifier;
    int type;
    int direction;
    int channel;
    int channel2;
    int different;
    mraa_iio_event_extract_event(data, &chan_type, &modifier, &type, &direction, &channel, &channel2, &different);

    fprintf(stdout,
            "event time %lld id %lld extracted chan_type %d modifier %d type %d direction %d "
            "channel %d channel2 %d different %d\n",
            data->timestamp, data->id, chan_type, modifier, type, direction, channel, channel2, different);
}